

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Ok> *
wasm::WATParser::table<wasm::WATParser::ParseModuleTypesCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  __index_type *__return_storage_ptr___00;
  Name NVar1;
  bool bVar2;
  bool bVar3;
  size_t sVar4;
  Name *pNVar5;
  Err *pEVar6;
  Type *pTVar7;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *pvVar8;
  ImportNames *pIVar9;
  char cVar10;
  basic_string_view<char,_std::char_traits<char>_> bVar11;
  Ok local_5e1;
  Err local_5e0;
  Err *local_5c0;
  Err *err_7;
  undefined1 local_5b0 [8];
  Result<wasm::Ok> _val_7;
  Err *err_6;
  undefined1 local_540 [8];
  Result<wasm::Ok> _val_6;
  string local_510;
  Err local_4f0;
  Err local_4d0;
  Err *local_4b0;
  Err *err_5;
  Result<wasm::Type> _val_5;
  undefined1 local_478 [8];
  Result<wasm::Type> tabtype;
  Type local_430;
  Type local_428;
  allocator<char> local_419;
  string local_418;
  Err local_3f8;
  Err local_3d0;
  Err *local_3b0;
  Err *err_4;
  MaybeResult<wasm::Ok> _val_4;
  MaybeResult<wasm::Ok> func;
  Err local_350;
  Err *local_330;
  Err *err_3;
  MaybeResult<wasm::Ok> _val_3;
  MaybeResult<wasm::Ok> elem;
  bool foundElem;
  Type local_2c8;
  Type list;
  string local_2b8;
  Err local_298;
  allocator<char> local_271;
  string local_270;
  Err local_250;
  basic_string_view<char,_std::char_traits<char>_> local_230;
  undefined1 local_220 [8];
  optional<wasm::Type> elems;
  optional<wasm::Type> ttype;
  Err *err_2;
  MaybeResult<wasm::Type> _val_2;
  MaybeResult<wasm::Type> type;
  BasicType local_164;
  undefined1 local_160 [4];
  BasicType addressType;
  Err *local_140;
  Err *err_1;
  MaybeResult<wasm::WATParser::ImportNames> _val_1;
  MaybeResult<wasm::WATParser::ImportNames> import;
  Err local_e0;
  Err *local_c0;
  Err *err;
  undefined1 local_a8 [8];
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> _val;
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> exports;
  optional<wasm::Name> id;
  Name name;
  Index local_20;
  size_t pos;
  ParseModuleTypesCtx *ctx_local;
  
  sVar4 = Lexer::getPos(&ctx->in);
  bVar11 = sv("table",5);
  bVar2 = Lexer::takeSExprStart(&ctx->in,bVar11);
  if (!bVar2) {
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  wasm::Name::Name((Name *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::Name>._M_engaged);
  Lexer::takeID((optional<wasm::Name> *)
                ((long)&exports.val.
                        super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                        .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                        super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                        super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                        super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20),&ctx->in)
  ;
  bVar2 = std::optional::operator_cast_to_bool
                    ((optional *)
                     ((long)&exports.val.
                             super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                             .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
  if (bVar2) {
    pNVar5 = std::optional<wasm::Name>::operator*
                       ((optional<wasm::Name> *)
                        ((long)&exports.val.
                                super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                                .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                                super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                                super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                                super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
    wasm::Name::operator=
              ((Name *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::Name>._M_engaged,pNVar5);
  }
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.
               super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
               super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
               super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
               super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
               super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20);
  inlineExports((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)
                __return_storage_ptr___00,&ctx->in);
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::Result
            ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_a8,
             (Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)
             __return_storage_ptr___00);
  local_c0 = Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::getErr
                       ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_a8);
  bVar2 = local_c0 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_e0,local_c0);
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_e0);
    wasm::Err::~Err(&local_e0);
  }
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::~Result
            ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_a8);
  if (bVar2) goto LAB_02417a7a;
  inlineImport((MaybeResult<wasm::WATParser::ImportNames> *)
               ((long)&_val_1.val.
                       super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       .super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> +
               0x20),&ctx->in);
  MaybeResult<wasm::WATParser::ImportNames>::MaybeResult
            ((MaybeResult<wasm::WATParser::ImportNames> *)&err_1,
             (MaybeResult<wasm::WATParser::ImportNames> *)
             ((long)&_val_1.val.
                     super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> +
             0x20));
  local_140 = MaybeResult<wasm::WATParser::ImportNames>::getErr
                        ((MaybeResult<wasm::WATParser::ImportNames> *)&err_1);
  bVar2 = local_140 == (Err *)0x0;
  if (!bVar2) {
    wasm::Err::Err((Err *)local_160,local_140);
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,(Err *)local_160);
    wasm::Err::~Err((Err *)local_160);
  }
  MaybeResult<wasm::WATParser::ImportNames>::~MaybeResult
            ((MaybeResult<wasm::WATParser::ImportNames> *)&err_1);
  if (bVar2) {
    local_164 = i32;
    bVar11 = sv("i64",3);
    bVar2 = Lexer::takeKeyword(&ctx->in,bVar11);
    if (bVar2) {
      local_164 = i64;
    }
    else {
      bVar11 = sv("i32",3);
      Lexer::takeKeyword(&ctx->in,bVar11);
    }
    maybeReftype<wasm::WATParser::ParseModuleTypesCtx>
              ((MaybeResult<wasm::Type> *)
               ((long)&_val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20),ctx);
    MaybeResult<wasm::Type>::MaybeResult
              ((MaybeResult<wasm::Type> *)&err_2,
               (MaybeResult<wasm::Type> *)
               ((long)&_val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20));
    pEVar6 = MaybeResult<wasm::Type>::getErr((MaybeResult<wasm::Type> *)&err_2);
    if (pEVar6 != (Err *)0x0) {
      wasm::Err::Err((Err *)&ttype.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                             super__Optional_payload_base<wasm::Type>._M_engaged,pEVar6);
      MaybeResult<wasm::Ok>::MaybeResult
                (__return_storage_ptr__,
                 (Err *)&ttype.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Type>._M_engaged);
      wasm::Err::~Err((Err *)&ttype.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                              super__Optional_payload_base<wasm::Type>._M_engaged);
    }
    MaybeResult<wasm::Type>::~MaybeResult((MaybeResult<wasm::Type> *)&err_2);
    if (pEVar6 == (Err *)0x0) {
      std::optional<wasm::Type>::optional
                ((optional<wasm::Type> *)
                 &elems.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Type>._M_engaged);
      std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_220);
      bVar2 = wasm::MaybeResult::operator_cast_to_bool
                        ((MaybeResult *)
                         ((long)&_val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20));
      if (bVar2) {
        local_230 = sv("elem",4);
        bVar2 = Lexer::takeSExprStart(&ctx->in,local_230);
        if (bVar2) {
          bVar2 = wasm::MaybeResult::operator_cast_to_bool
                            ((MaybeResult *)
                             ((long)&_val_1.val.
                                     super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                     .
                                     super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                             + 0x20));
          if (bVar2) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2b8,"imported tables cannot have inline elements",
                       (allocator<char> *)((long)&list.id + 7));
            Lexer::err(&local_298,&ctx->in,&local_2b8);
            MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_298);
            wasm::Err::~Err(&local_298);
            std::__cxx11::string::~string((string *)&local_2b8);
            std::allocator<char>::~allocator((allocator<char> *)((long)&list.id + 7));
          }
          else {
            pTVar7 = MaybeResult<wasm::Type>::operator*
                               ((MaybeResult<wasm::Type> *)
                                ((long)&_val_2.val.
                                        super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> +
                                0x20));
            local_2c8 = ParseModuleTypesCtx::makeElemList(ctx,pTVar7->id);
            bVar2 = false;
            do {
              maybeElemexpr<wasm::WATParser::ParseModuleTypesCtx>
                        ((MaybeResult<wasm::Ok> *)
                         ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),ctx
                        );
              bVar3 = wasm::MaybeResult::operator_cast_to_bool
                                ((MaybeResult *)
                                 ((long)&_val_3.val.
                                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                                 0x20));
              if (bVar3) {
                MaybeResult<wasm::Ok>::MaybeResult
                          ((MaybeResult<wasm::Ok> *)&err_3,
                           (MaybeResult<wasm::Ok> *)
                           ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
                local_330 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)&err_3);
                cVar10 = local_330 != (Err *)0x0;
                if ((bool)cVar10) {
                  wasm::Err::Err(&local_350,local_330);
                  MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_350);
                  wasm::Err::~Err(&local_350);
                }
                MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)&err_3);
                if (!(bool)cVar10) {
                  MaybeResult<wasm::Ok>::operator*
                            ((MaybeResult<wasm::Ok> *)
                             ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                     .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20)
                            );
                  ParseModuleTypesCtx::appendElem(ctx,&local_2c8);
                  bVar2 = true;
                  cVar10 = '\0';
                }
              }
              else {
                cVar10 = '\x03';
              }
              MaybeResult<wasm::Ok>::~MaybeResult
                        ((MaybeResult<wasm::Ok> *)
                         ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
            } while (cVar10 == '\0');
            if (cVar10 == '\x03') {
              if (!bVar2) {
                do {
                  maybeFuncidx<wasm::WATParser::ParseModuleTypesCtx>
                            ((MaybeResult<wasm::Ok> *)
                             ((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                     .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20)
                             ,ctx);
                  bVar2 = wasm::MaybeResult::operator_cast_to_bool
                                    ((MaybeResult *)
                                     ((long)&_val_4.val.
                                             super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                             .
                                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                             .
                                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                             .
                                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                     + 0x20));
                  if (bVar2) {
                    MaybeResult<wasm::Ok>::MaybeResult
                              ((MaybeResult<wasm::Ok> *)&err_4,
                               (MaybeResult<wasm::Ok> *)
                               ((long)&_val_4.val.
                                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                               0x20));
                    local_3b0 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)&err_4);
                    cVar10 = local_3b0 != (Err *)0x0;
                    if ((bool)cVar10) {
                      wasm::Err::Err(&local_3d0,local_3b0);
                      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_3d0);
                      wasm::Err::~Err(&local_3d0);
                    }
                    MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)&err_4);
                    if (!(bool)cVar10) {
                      MaybeResult<wasm::Ok>::operator*
                                ((MaybeResult<wasm::Ok> *)
                                 ((long)&_val_4.val.
                                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                                 0x20));
                      ParseModuleTypesCtx::appendFuncElem(ctx,&local_2c8);
                      cVar10 = '\0';
                    }
                  }
                  else {
                    cVar10 = '\x05';
                  }
                  MaybeResult<wasm::Ok>::~MaybeResult
                            ((MaybeResult<wasm::Ok> *)
                             ((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                     .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20)
                            );
                } while (cVar10 == '\0');
                if (cVar10 != '\x05') goto LAB_02417a42;
              }
              bVar2 = Lexer::takeRParen(&ctx->in);
              if (bVar2) {
                wasm::Type::Type(&local_430,local_164);
                ParseModuleTypesCtx::getLimitsFromElems(ctx,(ElemListT)local_2c8.id);
                pTVar7 = MaybeResult<wasm::Type>::operator*
                                   ((MaybeResult<wasm::Type> *)
                                    ((long)&_val_2.val.
                                            super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                            super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                            .
                                            super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                            .
                                            super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>
                                            .
                                            super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>
                                    + 0x20));
                tabtype.val.super__Variant_base<wasm::Type,_wasm::Err>.
                super__Move_assign_alias<wasm::Type,_wasm::Err>.
                super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ = pTVar7->id;
                local_428 = ParseModuleTypesCtx::makeTableType
                                      (ctx,local_430.id,
                                       tabtype.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                                       super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_);
                std::optional<wasm::Type>::operator=
                          ((optional<wasm::Type> *)
                           &elems.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::Type>._M_engaged,&local_428);
                std::optional<wasm::Type>::operator=((optional<wasm::Type> *)local_220,&local_2c8);
                goto LAB_0241766a;
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_418,"expected end of inline elems",&local_419);
              Lexer::err(&local_3f8,&ctx->in,&local_418);
              MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_3f8);
              wasm::Err::~Err(&local_3f8);
              std::__cxx11::string::~string((string *)&local_418);
              std::allocator<char>::~allocator(&local_419);
            }
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_270,"expected table limits or inline elements",&local_271);
          Lexer::err(&local_250,&ctx->in,&local_270);
          MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_250);
          wasm::Err::~Err(&local_250);
          std::__cxx11::string::~string((string *)&local_270);
          std::allocator<char>::~allocator(&local_271);
        }
      }
      else {
        wasm::Type::Type((Type *)((long)&_val_5.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                         super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),
                         local_164);
        tabletypeContinued<wasm::WATParser::ParseModuleTypesCtx>
                  ((Result<wasm::Type> *)local_478,ctx,
                   (Type)_val_5.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_);
        Result<wasm::Type>::Result((Result<wasm::Type> *)&err_5,(Result<wasm::Type> *)local_478);
        pEVar6 = Result<wasm::Type>::getErr((Result<wasm::Type> *)&err_5);
        local_4b0 = pEVar6;
        if (pEVar6 != (Err *)0x0) {
          wasm::Err::Err(&local_4d0,pEVar6);
          MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_4d0);
          wasm::Err::~Err(&local_4d0);
        }
        Result<wasm::Type>::~Result((Result<wasm::Type> *)&err_5);
        if (pEVar6 == (Err *)0x0) {
          pTVar7 = Result<wasm::Type>::operator*((Result<wasm::Type> *)local_478);
          std::optional<wasm::Type>::operator=
                    ((optional<wasm::Type> *)
                     &elems.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::Type>._M_engaged,pTVar7);
        }
        Result<wasm::Type>::~Result((Result<wasm::Type> *)local_478);
        if (pEVar6 == (Err *)0x0) {
LAB_0241766a:
          bVar2 = Lexer::takeRParen(&ctx->in);
          if (bVar2) {
            pvVar8 = Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::operator*
                               ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)
                                ((long)&_val.val.
                                        super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                                        .
                                        super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>
                                        .
                                        super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>
                                        .super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                                        super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> +
                                0x20));
            pIVar9 = MaybeResult<wasm::WATParser::ImportNames>::getPtr
                               ((MaybeResult<wasm::WATParser::ImportNames> *)
                                ((long)&_val_1.val.
                                        super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                        .
                                        super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                        .
                                        super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                        .
                                        super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                        .
                                        super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                + 0x20));
            pTVar7 = std::optional<wasm::Type>::operator*
                               ((optional<wasm::Type> *)
                                &elems.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                                 super__Optional_payload_base<wasm::Type>._M_engaged);
            local_20 = (Index)sVar4;
            NVar1.super_IString.str._M_str = (char *)name.super_IString.str._M_len;
            NVar1.super_IString.str._M_len =
                 id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Name>._16_8_;
            ParseModuleTypesCtx::addTable
                      ((Result<wasm::Ok> *)local_540,ctx,NVar1,pvVar8,pIVar9,(Type)pTVar7->id,
                       local_20);
            pEVar6 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_540);
            if (pEVar6 != (Err *)0x0) {
              wasm::Err::Err((Err *)((long)&_val_7.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                             pEVar6);
              MaybeResult<wasm::Ok>::MaybeResult
                        (__return_storage_ptr__,
                         (Err *)((long)&_val_7.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              wasm::Err::~Err((Err *)((long)&_val_7.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            }
            Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_540);
            if (pEVar6 == (Err *)0x0) {
              bVar2 = std::optional::operator_cast_to_bool((optional *)local_220);
              if (bVar2) {
                pTVar7 = MaybeResult<wasm::Type>::operator*
                                   ((MaybeResult<wasm::Type> *)
                                    ((long)&_val_2.val.
                                            super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                            super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                            .
                                            super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>
                                            .
                                            super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>
                                            .
                                            super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>
                                    + 0x20));
                err_7 = (Err *)pTVar7->id;
                pTVar7 = std::optional<wasm::Type>::operator*((optional<wasm::Type> *)local_220);
                ParseModuleTypesCtx::addImplicitElems
                          ((Result<wasm::Ok> *)local_5b0,ctx,(Type)err_7,pTVar7);
                local_5c0 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_5b0);
                bVar2 = local_5c0 != (Err *)0x0;
                if (bVar2) {
                  wasm::Err::Err(&local_5e0,local_5c0);
                  MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_5e0);
                  wasm::Err::~Err(&local_5e0);
                }
                Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_5b0);
                if (bVar2) goto LAB_02417a42;
              }
              MaybeResult<wasm::Ok>::MaybeResult<wasm::Ok>(__return_storage_ptr__,&local_5e1);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_510,"expected end of table declaration",
                       (allocator<char> *)
                       ((long)&_val_6.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
            Lexer::err(&local_4f0,&ctx->in,&local_510);
            MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_4f0);
            wasm::Err::~Err(&local_4f0);
            std::__cxx11::string::~string((string *)&local_510);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&_val_6.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
          }
        }
      }
    }
LAB_02417a42:
    MaybeResult<wasm::Type>::~MaybeResult
              ((MaybeResult<wasm::Type> *)
               ((long)&_val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20));
  }
  MaybeResult<wasm::WATParser::ImportNames>::~MaybeResult
            ((MaybeResult<wasm::WATParser::ImportNames> *)
             ((long)&_val_1.val.
                     super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> +
             0x20));
LAB_02417a7a:
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::~Result
            ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)
             ((long)&_val.val.
                     super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                     .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                     super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                     super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                     super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> table(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  if (!ctx.in.takeSExprStart("table"sv)) {
    return {};
  }

  Name name;
  if (auto id = ctx.in.takeID()) {
    name = *id;
  }

  auto exports = inlineExports(ctx.in);
  CHECK_ERR(exports);

  auto import = inlineImport(ctx.in);
  CHECK_ERR(import);

  auto addressType = Type::i32;
  if (ctx.in.takeKeyword("i64"sv)) {
    addressType = Type::i64;
  } else {
    ctx.in.takeKeyword("i32"sv);
  }

  // Reftype if we have inline elements.
  auto type = maybeReftype(ctx);
  CHECK_ERR(type);

  std::optional<typename Ctx::TableTypeT> ttype;
  std::optional<typename Ctx::ElemListT> elems;
  if (type) {
    // We should have inline elements.
    if (!ctx.in.takeSExprStart("elem"sv)) {
      return ctx.in.err("expected table limits or inline elements");
    }
    if (import) {
      return ctx.in.err("imported tables cannot have inline elements");
    }

    auto list = ctx.makeElemList(*type);
    bool foundElem = false;
    while (auto elem = maybeElemexpr(ctx)) {
      CHECK_ERR(elem);
      ctx.appendElem(list, *elem);
      foundElem = true;
    }

    // If there were no elemexprs, then maybe we have funcidxs instead.
    if (!foundElem) {
      while (auto func = maybeFuncidx(ctx)) {
        CHECK_ERR(func);
        ctx.appendFuncElem(list, *func);
      }
    }

    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of inline elems");
    }
    ttype = ctx.makeTableType(addressType, ctx.getLimitsFromElems(list), *type);
    elems = std::move(list);
  } else {
    auto tabtype = tabletypeContinued(ctx, addressType);
    CHECK_ERR(tabtype);
    ttype = *tabtype;
  }

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of table declaration");
  }

  CHECK_ERR(ctx.addTable(name, *exports, import.getPtr(), *ttype, pos));

  if (elems) {
    CHECK_ERR(ctx.addImplicitElems(*type, std::move(*elems)));
  }

  return Ok{};
}